

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateGLImpl.cpp
# Opt level: O1

void __thiscall
Diligent::PipelineStateGLImpl::
PipelineBuilder<Diligent::ComputePipelineStateCreateInfo,_Diligent::ComputePipelineStateCreateInfoX>
::HandleDefaultState
          (PipelineBuilder<Diligent::ComputePipelineStateCreateInfo,_Diligent::ComputePipelineStateCreateInfoX>
           *this)

{
  char (*in_RCX) [26];
  string msg;
  string local_30;
  
  if ((this->super_PipelineBuilderBase).m_State != Default) {
    FormatString<char[26],char[26]>
              (&local_30,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_State == State::Default",in_RCX);
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"HandleDefaultState",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineStateGLImpl.cpp"
               ,0x151);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
  }
  InitInternalObjects<Diligent::ComputePipelineStateCreateInfo>
            ((this->super_PipelineBuilderBase).m_Pipeline,
             (ComputePipelineStateCreateInfo *)&this->m_CreateInfo,
             &(this->super_PipelineBuilderBase).m_Shaders);
  (this->super_PipelineBuilderBase).m_State = WaitingShaders;
  return;
}

Assistant:

void HandleDefaultState()
    {
        VERIFY_EXPR(m_State == State::Default);
        m_Pipeline.InitInternalObjects<PSOCreateInfoType>(m_CreateInfo, m_Shaders);
        m_State = State::WaitingShaders;
    }